

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

int __thiscall
icu_63::FieldPosition::clone
          (FieldPosition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)0x0;
  }
  else {
    *puVar1 = &PTR__FieldPosition_0047a8f0;
    *(int32_t *)(puVar1 + 1) = this->fField;
    *(int32_t *)((long)puVar1 + 0xc) = this->fBeginIndex;
    *(int32_t *)(puVar1 + 2) = this->fEndIndex;
  }
  return (int)puVar1;
}

Assistant:

FieldPosition *
FieldPosition::clone() const {
    return new FieldPosition(*this);
}